

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O1

GLFWbool resizeWindow(_GLFWwindow *window,int width,int height)

{
  uint uVar1;
  wl_proxy *pwVar2;
  PFN_wl_proxy_marshal_flags p_Var3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  undefined8 in_RAX;
  GLFWbool GVar7;
  undefined4 uVar9;
  undefined8 uVar8;
  
  uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
  iVar4 = _glfw_max(width,1);
  iVar5 = _glfw_max(height,1);
  if ((iVar4 != (window->wl).width) || (GVar7 = 0, iVar5 != (window->wl).height)) {
    (window->wl).width = iVar4;
    (window->wl).height = iVar5;
    resizeFramebuffer(window);
    p_Var3 = _glfw.wl.client.proxy_marshal_flags;
    pwVar2 = (wl_proxy *)(window->wl).scalingViewport;
    if (pwVar2 != (wl_proxy *)0x0) {
      uVar1 = (window->wl).width;
      iVar4 = (window->wl).height;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      uVar8 = CONCAT44(uVar9,iVar4);
      (*p_Var3)(pwVar2,2,(wl_interface *)0x0,uVar6,0,(ulong)uVar1,uVar8);
      uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
    }
    p_Var3 = _glfw.wl.client.proxy_marshal_flags;
    if ((window->wl).fallback.decorations == 0) {
      GVar7 = 1;
    }
    else {
      pwVar2 = (wl_proxy *)(window->wl).fallback.top.viewport;
      uVar1 = (window->wl).width;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      uVar8 = CONCAT44(uVar9,0x18);
      (*p_Var3)(pwVar2,2,(wl_interface *)0x0,uVar6,0,(ulong)uVar1,uVar8);
      p_Var3 = _glfw.wl.client.proxy_marshal_flags;
      uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
      pwVar2 = (wl_proxy *)(window->wl).fallback.top.surface;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      (*p_Var3)(pwVar2,6,(wl_interface *)0x0,uVar6,0);
      p_Var3 = _glfw.wl.client.proxy_marshal_flags;
      pwVar2 = (wl_proxy *)(window->wl).fallback.left.viewport;
      iVar4 = (window->wl).height;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      uVar8 = CONCAT44(uVar9,iVar4 + 0x18);
      (*p_Var3)(pwVar2,2,(wl_interface *)0x0,uVar6,0,4,uVar8);
      p_Var3 = _glfw.wl.client.proxy_marshal_flags;
      uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
      pwVar2 = (wl_proxy *)(window->wl).fallback.left.surface;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      (*p_Var3)(pwVar2,6,(wl_interface *)0x0,uVar6,0);
      p_Var3 = _glfw.wl.client.proxy_marshal_flags;
      pwVar2 = (wl_proxy *)(window->wl).fallback.right.subsurface;
      uVar1 = (window->wl).width;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      uVar8 = CONCAT44(uVar9,0xffffffe8);
      GVar7 = 1;
      (*p_Var3)(pwVar2,1,(wl_interface *)0x0,uVar6,0,(ulong)uVar1,uVar8);
      p_Var3 = _glfw.wl.client.proxy_marshal_flags;
      uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
      pwVar2 = (wl_proxy *)(window->wl).fallback.right.viewport;
      iVar4 = (window->wl).height;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      uVar8 = CONCAT44(uVar9,iVar4 + 0x18);
      (*p_Var3)(pwVar2,2,(wl_interface *)0x0,uVar6,0,4,uVar8);
      p_Var3 = _glfw.wl.client.proxy_marshal_flags;
      uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
      pwVar2 = (wl_proxy *)(window->wl).fallback.right.surface;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      (*p_Var3)(pwVar2,6,(wl_interface *)0x0,uVar6,0);
      p_Var3 = _glfw.wl.client.proxy_marshal_flags;
      pwVar2 = (wl_proxy *)(window->wl).fallback.bottom.subsurface;
      iVar4 = (window->wl).height;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      uVar8 = CONCAT44(uVar9,iVar4);
      (*p_Var3)(pwVar2,1,(wl_interface *)0x0,uVar6,0,0xfffffffc,uVar8);
      p_Var3 = _glfw.wl.client.proxy_marshal_flags;
      uVar9 = (undefined4)((ulong)uVar8 >> 0x20);
      pwVar2 = (wl_proxy *)(window->wl).fallback.bottom.viewport;
      iVar4 = (window->wl).width;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      (*p_Var3)(pwVar2,2,(wl_interface *)0x0,uVar6,0,(ulong)(iVar4 + 8),CONCAT44(uVar9,4));
      p_Var3 = _glfw.wl.client.proxy_marshal_flags;
      pwVar2 = (wl_proxy *)(window->wl).fallback.bottom.surface;
      uVar6 = (*_glfw.wl.client.proxy_get_version)(pwVar2);
      (*p_Var3)(pwVar2,6,(wl_interface *)0x0,uVar6,0);
    }
  }
  return GVar7;
}

Assistant:

static GLFWbool resizeWindow(_GLFWwindow* window, int width, int height)
{
    width = _glfw_max(width, 1);
    height = _glfw_max(height, 1);

    if (width == window->wl.width && height == window->wl.height)
        return GLFW_FALSE;

    window->wl.width = width;
    window->wl.height = height;

    resizeFramebuffer(window);

    if (window->wl.scalingViewport)
    {
        wp_viewport_set_destination(window->wl.scalingViewport,
                                    window->wl.width,
                                    window->wl.height);
    }

    if (window->wl.fallback.decorations)
    {
        wp_viewport_set_destination(window->wl.fallback.top.viewport,
                                    window->wl.width,
                                    GLFW_CAPTION_HEIGHT);
        wl_surface_commit(window->wl.fallback.top.surface);

        wp_viewport_set_destination(window->wl.fallback.left.viewport,
                                    GLFW_BORDER_SIZE,
                                    window->wl.height + GLFW_CAPTION_HEIGHT);
        wl_surface_commit(window->wl.fallback.left.surface);

        wl_subsurface_set_position(window->wl.fallback.right.subsurface,
                                window->wl.width, -GLFW_CAPTION_HEIGHT);
        wp_viewport_set_destination(window->wl.fallback.right.viewport,
                                    GLFW_BORDER_SIZE,
                                    window->wl.height + GLFW_CAPTION_HEIGHT);
        wl_surface_commit(window->wl.fallback.right.surface);

        wl_subsurface_set_position(window->wl.fallback.bottom.subsurface,
                                -GLFW_BORDER_SIZE, window->wl.height);
        wp_viewport_set_destination(window->wl.fallback.bottom.viewport,
                                    window->wl.width + GLFW_BORDER_SIZE * 2,
                                    GLFW_BORDER_SIZE);
        wl_surface_commit(window->wl.fallback.bottom.surface);
    }

    return GLFW_TRUE;
}